

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Company *company)

{
  Employee *__a;
  undefined8 uVar1;
  Boss *boss;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  long *plVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  string *psVar11;
  ostream *poVar12;
  ulong __n;
  ulong uVar13;
  long lVar14;
  undefined **ppuVar15;
  long lVar16;
  Employee *pEVar17;
  ulong uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  Employee *pEVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  int j;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  Employee *apEStack_d0 [3];
  Company *local_b8;
  ulong local_b0;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  long *local_88;
  ulong local_80;
  long local_78 [2];
  uint local_64;
  long local_60;
  Employee *local_58;
  Employee *local_50;
  Employee *local_48;
  undefined **local_40;
  ostream *local_38;
  
  apEStack_d0[0] = (Employee *)0x105275;
  local_38 = os;
  uVar9 = Boss::getNumberOfEmployees(company->boss);
  local_40 = (undefined **)(ulong)uVar9;
  local_60 = (long)local_40 * 0xb8;
  lVar5 = -(local_60 + 0xfU & 0xfffffffffffffff0);
  pEVar20 = (Employee *)((long)apEStack_d0 + lVar5 + 8);
  if (uVar9 != 0) {
    pEVar17 = pEVar20;
    do {
      (pEVar17->super_Person).name._M_dataplus._M_p = (pointer)&(pEVar17->super_Person).name.field_2
      ;
      (pEVar17->super_Person).name._M_string_length = 0;
      (pEVar17->super_Person).name.field_2._M_local_buf[0] = '\0';
      (pEVar17->super_Person).id._M_dataplus._M_p = (pointer)&(pEVar17->super_Person).id.field_2;
      (pEVar17->super_Person).id._M_string_length = 0;
      (pEVar17->super_Person).id.field_2._M_local_buf[0] = '\0';
      (pEVar17->super_Person).address.country._M_dataplus._M_p =
           (pointer)&(pEVar17->super_Person).address.country.field_2;
      (pEVar17->super_Person).address.country._M_string_length = 0;
      (pEVar17->super_Person).address.country.field_2._M_local_buf[0] = '\0';
      (pEVar17->super_Person).address.city._M_dataplus._M_p =
           (pointer)&(pEVar17->super_Person).address.city.field_2;
      (pEVar17->super_Person).address.city._M_string_length = 0;
      (pEVar17->super_Person).address.city.field_2._M_local_buf[0] = '\0';
      (pEVar17->super_Person).address.street._M_dataplus._M_p =
           (pointer)&(pEVar17->super_Person).address.street.field_2;
      (pEVar17->super_Person).address.street._M_string_length = 0;
      (pEVar17->super_Person).address.street.field_2._M_local_buf[0] = '\0';
      (pEVar17->super_Person)._vptr_Person = (_func_int **)&PTR_validate_00109d68;
      pEVar17 = pEVar17 + 1;
    } while (pEVar17 != pEVar20 + (long)local_40);
  }
  local_58 = pEVar20;
  if (0 < (int)uVar9) {
    uVar13 = 0;
    do {
      pEVar17 = company->employees[uVar13];
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105336;
      Employee::operator=(pEVar20,pEVar17);
      uVar13 = uVar13 + 1;
      pEVar20 = pEVar20 + 1;
    } while (local_40 != (undefined **)uVar13);
  }
  local_64 = (int)local_40 - 1;
  local_b8 = company;
  if (1 < (int)local_40) {
    local_b0 = (long)local_40 - 1;
    apEStack_d0[2] = (Employee *)(ulong)local_64;
    apEStack_d0[1] = (Employee *)((long)&local_58[-2].super_Person._vptr_Person + local_60);
    local_48 = (Employee *)0x0;
    pEVar20 = apEStack_d0[1];
    uVar13 = local_b0;
    do {
      pEVar17 = pEVar20 + 1;
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1053b5;
      psVar11 = Person::getId_abi_cxx11_(&pEVar17->super_Person);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1053c8;
      std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar11);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1053d0;
      psVar11 = Person::getId_abi_cxx11_(&pEVar20->super_Person);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1053e6;
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)psVar11);
      uVar8 = local_80;
      plVar7 = local_88;
      uVar18 = local_a0;
      plVar2 = local_a8;
      __n = local_80;
      if (local_a0 < local_80) {
        __n = local_a0;
      }
      local_50 = pEVar17;
      if (__n == 0) {
        iVar10 = 0;
      }
      else {
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105414;
        iVar10 = memcmp(plVar7,plVar2,__n);
      }
      plVar2 = local_a8;
      if (iVar10 == 0) {
        lVar14 = uVar8 - uVar18;
        if (lVar14 < -0x7fffffff) {
          lVar14 = -0x80000000;
        }
        if (0x7ffffffe < lVar14) {
          lVar14 = 0x7fffffff;
        }
        iVar10 = (int)lVar14;
      }
      if (local_a8 != local_98) {
        uVar18 = local_98[0] + 1;
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105467;
        operator_delete(plVar2,uVar18);
      }
      plVar2 = local_88;
      if (local_88 != local_78) {
        uVar18 = local_78[0] + 1;
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105480;
        operator_delete(plVar2,uVar18);
      }
      pEVar17 = local_50;
      if (iVar10 < 0) {
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105491;
        std::swap<Employee>(pEVar17,pEVar20);
      }
      uVar13 = uVar13 - 1;
      pEVar20 = pEVar20 + -1;
    } while (((long)local_48 < (long)uVar13) ||
            (local_48 = (Employee *)((long)&(local_48->super_Person)._vptr_Person + 1),
            pEVar20 = apEStack_d0[1], uVar13 = local_b0, local_48 != apEStack_d0[2]));
  }
  if (1 < (int)local_40) {
    local_50 = (Employee *)((long)local_40 - 1);
    local_b0 = (ulong)local_64;
    local_48 = (Employee *)((long)&local_58[-2].super_Person._vptr_Person + local_60);
    uVar13 = 0;
    pEVar20 = local_48;
    pEVar17 = local_50;
    do {
      __a = pEVar20 + 1;
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10550a;
      psVar11 = Person::getId_abi_cxx11_(&__a->super_Person);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10551d;
      std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar11);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105525;
      psVar11 = Person::getId_abi_cxx11_(&pEVar20->super_Person);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10553b;
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)psVar11);
      uVar18 = local_80;
      plVar7 = local_88;
      plVar2 = local_a8;
      if (local_80 == local_a0) {
        if (local_80 != 0) {
          *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10555d;
          iVar10 = bcmp(plVar7,plVar2,uVar18);
          if (iVar10 != 0) goto LAB_00105561;
        }
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1055a9;
        psVar11 = Person::getName_abi_cxx11_(&__a->super_Person);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1055b4;
        Person::getName_abi_cxx11_(&pEVar20->super_Person);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1055bf;
        iVar10 = std::__cxx11::string::compare((string *)psVar11);
        plVar2 = local_a8;
        if (local_a8 != local_98) {
          uVar18 = local_98[0] + 1;
          *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1055e4;
          operator_delete(plVar2,uVar18);
        }
        plVar2 = local_88;
        if (local_88 != local_78) {
          uVar18 = local_78[0] + 1;
          *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1055fd;
          operator_delete(plVar2,uVar18);
        }
        if (iVar10 < 0) {
          *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10560d;
          std::swap<Employee>(__a,pEVar20);
        }
      }
      else {
LAB_00105561:
        plVar2 = local_a8;
        if (local_a8 != local_98) {
          uVar18 = local_98[0] + 1;
          *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105583;
          operator_delete(plVar2,uVar18);
        }
        plVar2 = local_88;
        if (local_88 != local_78) {
          uVar18 = local_78[0] + 1;
          *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10559c;
          operator_delete(plVar2,uVar18);
        }
      }
      pEVar17 = (Employee *)((long)&pEVar17[-1].workDone + 3);
      pEVar20 = pEVar20 + -1;
    } while (((long)uVar13 < (long)pEVar17) ||
            (uVar13 = uVar13 + 1, pEVar20 = local_48, pEVar17 = local_50, uVar13 != local_b0));
  }
  poVar12 = local_38;
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10564b;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Boss : ",7);
  uVar1 = *(undefined8 *)(*(long *)local_38 + -0x18);
  cVar6 = (char)local_38;
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105663;
  std::ios::widen((char)uVar1 + cVar6);
  poVar12 = local_38;
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10566f;
  std::ostream::put((char)poVar12);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105677;
  poVar12 = (ostream *)std::ostream::flush();
  boss = local_b8->boss;
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10568a;
  poVar12 = operator<<(poVar12,boss);
  uVar1 = *(undefined8 *)(*(long *)poVar12 + -0x18);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056a1;
  std::ios::widen((char)uVar1 + (char)poVar12);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056ac;
  std::ostream::put((char)poVar12);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056b4;
  poVar12 = (ostream *)std::ostream::flush();
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056cb;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"-------------------------------------\n",0x26);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056df;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Employees :",0xb);
  uVar1 = *(undefined8 *)(*(long *)poVar12 + -0x18);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056f3;
  std::ios::widen((char)uVar1 + (char)poVar12);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x1056fe;
  std::ostream::put((char)poVar12);
  *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105706;
  std::ostream::flush();
  ppuVar15 = local_40;
  pEVar20 = local_58;
  if (0 < (int)local_40) {
    do {
      poVar12 = local_38;
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10572b;
      poVar12 = operator<<(poVar12,pEVar20);
      uVar1 = *(undefined8 *)(*(long *)poVar12 + -0x18);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105742;
      std::ios::widen((char)uVar1 + (char)poVar12);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10574d;
      std::ostream::put((char)poVar12);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105755;
      poVar12 = (ostream *)std::ostream::flush();
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105768;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"----------------------------------------------------------------------",
                 0x46);
      uVar1 = *(undefined8 *)(*(long *)poVar12 + -0x18);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10577c;
      std::ios::widen((char)uVar1 + (char)poVar12);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105787;
      std::ostream::put((char)poVar12);
      *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10578f;
      std::ostream::flush();
      ppuVar15 = (undefined **)((long)ppuVar15 - 1);
      pEVar20 = pEVar20 + 1;
    } while (ppuVar15 != (undefined **)0x0);
  }
  if (local_40 != (undefined **)0x0) {
    local_50 = (Employee *)&local_58[-1].super_Person.name.field_2;
    paVar22 = &local_58[-1].super_Person.address.street.field_2;
    local_48 = (Employee *)&local_58[-1].super_Person.id.field_2;
    paVar21 = &local_58[-1].super_Person.address.country.field_2;
    paVar19 = &local_58[-1].super_Person.address.city.field_2;
    lVar16 = 0;
    local_40 = &PTR_validate_00109d98;
    lVar14 = local_60;
    do {
      *(undefined ***)((long)paVar22 + lVar14 + -0x98) = local_40;
      plVar2 = *(long **)((long)paVar22 + lVar14 + -0x10);
      if ((long *)(paVar22->_M_local_buf + lVar14) != plVar2) {
        lVar14 = *(long *)(paVar22->_M_local_buf + lVar14);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105807;
        operator_delete(plVar2,lVar14 + 1);
      }
      lVar14 = local_60;
      pcVar3 = *(char **)((long)paVar22 + local_60 + -0x30);
      if (paVar19->_M_local_buf + local_60 != pcVar3) {
        lVar4 = *(long *)((long)paVar22 + local_60 + -0x20);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105826;
        operator_delete(pcVar3,lVar4 + 1);
      }
      pcVar3 = *(char **)((long)paVar22 + lVar14 + -0x50);
      if (paVar21->_M_local_buf + lVar14 != pcVar3) {
        lVar4 = *(long *)((long)paVar22 + lVar14 + -0x40);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105841;
        operator_delete(pcVar3,lVar4 + 1);
      }
      pcVar3 = *(char **)((long)paVar22 + lVar14 + -0x70);
      if ((char *)((long)local_48 + lVar14) != pcVar3) {
        lVar4 = *(long *)((long)paVar22 + lVar14 + -0x60);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x10585f;
        operator_delete(pcVar3,lVar4 + 1);
      }
      pcVar3 = *(char **)((long)paVar22 + lVar14 + -0x90);
      if ((char *)((long)local_50 + lVar14) != pcVar3) {
        lVar4 = *(long *)((long)paVar22 + lVar14 + -0x80);
        *(undefined8 *)((long)apEStack_d0 + lVar5) = 0x105880;
        operator_delete(pcVar3,lVar4 + 1);
      }
      local_50 = (Employee *)((long)local_50 + -0xb8);
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar22 + -0xb8);
      local_48 = (Employee *)((long)local_48 + -0xb8);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar21 + -0xb8);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar19 + -0xb8);
      lVar16 = lVar16 + 0xb8;
    } while (lVar14 != lVar16);
  }
  return local_38;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    // copy the value of employees to another array to avoid changes in the original array
    int n = company.boss->getNumberOfEmployees();
    Employee newEmployees[n];
    for (int i = 0; i < n; ++i) {
        newEmployees[i] = *company.employees[i];
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the id's first two chars
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) < newEmployees[j - 1].getId().substr(0, 2))
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the name
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) == newEmployees[j - 1].getId().substr(0, 2) &&
                newEmployees[j].getName() < newEmployees[j - 1].getName())
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    os << "Boss : " << endl << *company.boss << endl << "-------------------------------------\n" << "Employees :"
       << endl;
    for (int i = 0; i < n; ++i) {
        os << newEmployees[i] << endl << "----------------------------------------------------------------------"
           << endl;
    }
    return os;
}